

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize
                 (seqStore_t *seqStore,ZSTD_CCtx *zc)

{
  symbolEncodingType_e sVar1;
  BYTE *codeTable;
  BYTE *codeTable_00;
  BYTE *codeTable_01;
  ZSTD_compressedBlockState_t *CTable;
  uint *count;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  ulong nbSeq;
  ulong sourceSize;
  U32 defaultMax;
  void *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint maxSymbolValue;
  
  sVar2 = ZSTD_buildBlockEntropyStats
                    (seqStore,&((zc->blockState).prevCBlock)->entropy,
                     &((zc->blockState).nextCBlock)->entropy,&zc->appliedParams,
                     &(zc->blockSplitCtx).entropyMetadata,zc->entropyWorkspace,0x22d8);
  if (sVar2 < 0xffffffffffffff89) {
    sourceSize = (long)seqStore->lit - (long)seqStore->litStart;
    codeTable = seqStore->ofCode;
    codeTable_00 = seqStore->llCode;
    codeTable_01 = seqStore->mlCode;
    nbSeq = (long)seqStore->sequences - (long)seqStore->sequencesStart >> 3;
    CTable = (zc->blockState).nextCBlock;
    count = zc->entropyWorkspace;
    sVar1 = (zc->blockSplitCtx).entropyMetadata.hufMetadata.hType;
    maxSymbolValue = 0xff;
    if (sVar1 - set_compressed < 2) {
      in_stack_ffffffffffffffa0 = (void *)0xf3a73a;
      sVar2 = HIST_count_wksp(count,(uint *)&stack0xffffffffffffffac,seqStore->litStart,sourceSize,
                              count,0x22d8);
      if (sVar2 < 0xffffffffffffff89) {
        in_stack_ffffffffffffffa0 = (void *)0xf3a755;
        sVar2 = HUF_estimateCompressedSize((HUF_CElt *)CTable,count,maxSymbolValue);
        if (sVar1 == set_compressed) {
          sVar2 = sVar2 + (zc->blockSplitCtx).entropyMetadata.hufMetadata.hufDesSize;
        }
        sVar3 = sVar2 + 6;
        if (sourceSize < 0x100) {
          sVar3 = sVar2;
        }
        sourceSize = ((ulong)(0x3ff < sourceSize) - (ulong)(sourceSize < 0x4000)) + 4 + sVar3;
      }
    }
    else if (sVar1 != set_basic) {
      if (sVar1 == set_rle) {
        in_stack_ffffffffffffffa0 = (void *)0x1;
        sourceSize = 1;
      }
      else {
        sourceSize = 0;
      }
    }
    defaultMax = (U32)count;
    sVar2 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.ofType,codeTable,nbSeq,0x1f,
                       (CTable->entropy).fse.offcodeCTable,(U8 *)0x0,(short *)OF_defaultNorm,5,
                       defaultMax,in_stack_ffffffffffffffa0,
                       CONCAT44(maxSymbolValue,in_stack_ffffffffffffffa8));
    sVar3 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.llType,codeTable_00,nbSeq,
                       0x23,(CTable->entropy).fse.litlengthCTable,LL_bits,(short *)LL_defaultNorm,6,
                       defaultMax,in_stack_ffffffffffffffa0,
                       CONCAT44(maxSymbolValue,in_stack_ffffffffffffffa8));
    sVar4 = ZSTD_estimateBlockSize_symbolType
                      ((zc->blockSplitCtx).entropyMetadata.fseMetadata.mlType,codeTable_01,nbSeq,
                       0x34,(CTable->entropy).fse.matchlengthCTable,ML_bits,(short *)ML_defaultNorm,
                       6,defaultMax,in_stack_ffffffffffffffa0,
                       CONCAT44(maxSymbolValue,in_stack_ffffffffffffffa8));
    sVar2 = (zc->blockSplitCtx).entropyMetadata.fseMetadata.fseTablesSize +
            sVar2 + sourceSize + sVar3 + sVar4 + ((ulong)(0x7f < nbSeq) - (ulong)(nbSeq < 0x7f00)) +
            6;
  }
  return sVar2;
}

Assistant:

static size_t
ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize(seqStore_t* seqStore, ZSTD_CCtx* zc)
{
    ZSTD_entropyCTablesMetadata_t* const entropyMetadata = &zc->blockSplitCtx.entropyMetadata;
    DEBUGLOG(6, "ZSTD_buildEntropyStatisticsAndEstimateSubBlockSize()");
    FORWARD_IF_ERROR(ZSTD_buildBlockEntropyStats(seqStore,
                    &zc->blockState.prevCBlock->entropy,
                    &zc->blockState.nextCBlock->entropy,
                    &zc->appliedParams,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE), "");
    return ZSTD_estimateBlockSize(
                    seqStore->litStart, (size_t)(seqStore->lit - seqStore->litStart),
                    seqStore->ofCode, seqStore->llCode, seqStore->mlCode,
                    (size_t)(seqStore->sequences - seqStore->sequencesStart),
                    &zc->blockState.nextCBlock->entropy,
                    entropyMetadata,
                    zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE,
                    (int)(entropyMetadata->hufMetadata.hType == set_compressed), 1);
}